

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall GlobOpt::IsWorthSpecializingToInt32DueToSrc(GlobOpt *this,Opnd *src,Value *val)

{
  ValueType *this_00;
  ValueInfo *this_01;
  BasicBlock *pBVar1;
  Loop *pLVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  bool bVar8;
  
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d24,"(src)","src");
    if (!bVar4) goto LAB_00463234;
    *puVar6 = 0;
  }
  if (val == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d25,"(val)","val");
    if (!bVar4) goto LAB_00463234;
    *puVar6 = 0;
  }
  this_01 = val->valueInfo;
  this_00 = &this_01->super_ValueType;
  bVar4 = ValueType::IsLikelyInt(this_00);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d27,"(valueInfo->IsLikelyInt())","valueInfo->IsLikelyInt()");
    if (!bVar4) goto LAB_00463234;
    *puVar6 = 0;
  }
  bVar4 = ValueType::IsInt(this_00);
  bVar8 = true;
  if (!bVar4) {
    bVar4 = ValueInfo::HasIntConstantValue(this_01,true);
    if ((!bVar4) && ((src->field_0xb & 4) != 0)) {
      OVar5 = IR::Opnd::GetKind(src);
      if (OVar5 == OpndKindReg) {
        pBVar1 = this->currentBlock;
        OVar5 = IR::Opnd::GetKind(src);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) {
LAB_00463234:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        bVar4 = GlobOptBlockData::IsInt32TypeSpecialized
                          (&pBVar1->globOptData,(Sym *)src[1]._vptr_Opnd);
        if (!bVar4) {
          pLVar2 = this->currentBlock->loop;
          if (pLVar2 != (Loop *)0x0) {
            pBVar1 = pLVar2->landingPad;
            pRVar7 = IR::Opnd::AsRegOpnd(src);
            bVar4 = GlobOptBlockData::IsLive(&pBVar1->globOptData,&pRVar7->m_sym->super_Sym);
            return bVar4;
          }
          bVar8 = false;
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32DueToSrc(IR::Opnd *const src, Value *const val)
{
    Assert(src);
    Assert(val);
    ValueInfo *valueInfo = val->GetValueInfo();
    Assert(valueInfo->IsLikelyInt());

    // If it is not known that the operand is definitely an int, the operand is not already type-specialized, and it's not live
    // in the loop landing pad (if we're in a loop), it's probably not worth type-specializing this instruction. The common case
    // where type-specializing this would be bad is where the operations are entirely on properties or array elements, where the
    // ratio of FromVars and ToVars to the number of actual operations is high, and the conversions would dominate the time
    // spent. On the other hand, if we're using a function formal parameter more than once, it would probably be worth
    // type-specializing it, hence the IsDead check on the operands.
    return
        valueInfo->IsInt() ||
        valueInfo->HasIntConstantValue(true) ||
        !src->GetIsDead() ||
        !src->IsRegOpnd() ||
        CurrentBlockData()->IsInt32TypeSpecialized(src->AsRegOpnd()->m_sym) ||
        (this->currentBlock->loop && this->currentBlock->loop->landingPad->globOptData.IsLive(src->AsRegOpnd()->m_sym));
}